

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

wchar_t canLzip(void)

{
  wchar_t wVar1;
  
  if (canLzip_tested == '\0') {
    canLzip_tested = '\x01';
    wVar1 = systemf("lzip --help %s",">/dev/null 2>/dev/null");
    if (wVar1 == L'\0') {
      canLzip_value = 1;
    }
  }
  return (uint)canLzip_value;
}

Assistant:

int
canLzip(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("lzip --help %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}